

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalBeginWriteTransaction(Wal *pWal)

{
  int iVar1;
  WalIndexHdr *__s2;
  int local_1c;
  int rc;
  Wal *pWal_local;
  
  if (pWal->readOnly == '\0') {
    local_1c = walLockExclusive(pWal,0,1);
    pWal_local._4_4_ = local_1c;
    if (local_1c == 0) {
      pWal->writeLock = '\x01';
      __s2 = walIndexHdr(pWal);
      iVar1 = memcmp(&pWal->hdr,__s2,0x30);
      if (iVar1 != 0) {
        walUnlockExclusive(pWal,0,1);
        pWal->writeLock = '\0';
        local_1c = 0x205;
      }
      pWal_local._4_4_ = local_1c;
    }
  }
  else {
    pWal_local._4_4_ = 8;
  }
  return pWal_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalBeginWriteTransaction(Wal *pWal){
  int rc;

  /* Cannot start a write transaction without first holding a read
  ** transaction. */
  assert( pWal->readLock>=0 );
  assert( pWal->writeLock==0 && pWal->iReCksum==0 );

  if( pWal->readOnly ){
    return SQLITE_READONLY;
  }

  /* Only one writer allowed at a time.  Get the write lock.  Return
  ** SQLITE_BUSY if unable.
  */
  rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1);
  if( rc ){
    return rc;
  }
  pWal->writeLock = 1;

  /* If another connection has written to the database file since the
  ** time the read transaction on this connection was started, then
  ** the write is disallowed.
  */
  if( memcmp(&pWal->hdr, (void *)walIndexHdr(pWal), sizeof(WalIndexHdr))!=0 ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
    rc = SQLITE_BUSY_SNAPSHOT;
  }

  return rc;
}